

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int estimate_obmc_mvcost(MV *this_mv,MV_COST_PARAMS *mv_cost_params)

{
  int iVar1;
  undefined8 *in_RSI;
  short *in_RDI;
  MV diff_mv;
  MV_COST_TYPE mv_cost_type;
  int error_per_bit;
  int **mvcost;
  int *mvjcost;
  MV *ref_mv;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffca;
  int iVar2;
  int local_4;
  
  iVar2 = *(int *)(in_RSI + 5);
  if (*(char *)((long)in_RSI + 0xc) == '\0') {
    iVar1 = mv_cost((MV *)(in_RSI + 3),
                    (int *)CONCAT44(iVar2,(uint)CONCAT12(in_stack_ffffffffffffffca,
                                                         (in_RDI[1] - ((short *)*in_RSI)[1]) * 8)),
                    (int **)((ulong)CONCAT22((*in_RDI - *(short *)*in_RSI) * 8,
                                             in_stack_ffffffffffffffc4) << 0x20));
    local_4 = iVar1 * iVar2 + 0x1000 >> 0xd;
  }
  else if (*(char *)((long)in_RSI + 0xc) == '\x04') {
    local_4 = 0;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int estimate_obmc_mvcost(const MV *this_mv,
                                       const MV_COST_PARAMS *mv_cost_params) {
  const MV *ref_mv = mv_cost_params->ref_mv;
  const int *mvjcost = mv_cost_params->mvjcost;
  const int *const *mvcost = mv_cost_params->mvcost;
  const int error_per_bit = mv_cost_params->error_per_bit;
  const MV_COST_TYPE mv_cost_type = mv_cost_params->mv_cost_type;
  const MV diff_mv = { GET_MV_SUBPEL(this_mv->row - ref_mv->row),
                       GET_MV_SUBPEL(this_mv->col - ref_mv->col) };

  switch (mv_cost_type) {
    case MV_COST_ENTROPY:
      return (unsigned)((mv_cost(&diff_mv, mvjcost,
                                 CONVERT_TO_CONST_MVCOST(mvcost)) *
                             error_per_bit +
                         4096) >>
                        13);
    case MV_COST_NONE: return 0;
    default:
      assert(0 && "L1 norm is not tuned for estimated obmc mvcost");
      return 0;
  }
}